

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

string * blink_text(string *__return_storage_ptr__,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"\x1b[5m",text);
  std::operator+(__return_storage_ptr__,&local_30,"\x1b[25m");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string blink_text(string text){return "\033[5m" + text + "\033[25m";}